

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::doReverse(UnicodeString *this,int32_t start,int32_t length)

{
  short sVar1;
  char16_t cVar2;
  char16_t cVar3;
  bool bVar4;
  UBool UVar5;
  int32_t iVar6;
  char16_t *pcVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  bool bVar13;
  
  if (1 < length) {
    UVar5 = cloneArrayIfNeeded(this,-1,-1,'\x01',(int32_t **)0x0,'\0');
    if (UVar5 != '\0') {
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
      iVar6 = start;
      if (iVar8 < start) {
        iVar6 = iVar8;
      }
      iVar10 = 0;
      if (-1 < start) {
        iVar10 = iVar6;
      }
      uVar9 = iVar8 - iVar10;
      if (length <= iVar8 - iVar10) {
        uVar9 = length;
      }
      if (1 < (int)uVar9) {
        pcVar7 = (char16_t *)((long)&this->fUnion + 2);
        pcVar12 = pcVar7;
        if (((int)sVar1 & 2U) == 0) {
          pcVar12 = (this->fUnion).fFields.fArray;
        }
        pcVar11 = pcVar12 + iVar10;
        bVar4 = false;
        pcVar12 = pcVar12 + (long)iVar10 + ((ulong)uVar9 - 2);
        do {
          cVar2 = *pcVar11;
          cVar3 = pcVar12[1];
          *pcVar11 = cVar3;
          pcVar12[1] = cVar2;
          pcVar11 = pcVar11 + 1;
          bVar4 = (bool)(bVar4 | (cVar2 & 0xfc00U) == 0xd800U | (cVar3 & 0xfc00U) == 0xd800U);
          bVar13 = pcVar11 < pcVar12;
          pcVar12 = pcVar12 + -1;
        } while (bVar13);
        if (bVar4 || (*pcVar11 & 0xfc00U) == 0xd800) {
          if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
              (undefined1  [56])0x0) {
            pcVar7 = (this->fUnion).fFields.fArray;
          }
          pcVar7 = pcVar7 + iVar10;
          pcVar12 = pcVar7 + ((ulong)uVar9 - 1);
          while (pcVar7 < pcVar12) {
            cVar2 = *pcVar7;
            if (((cVar2 & 0xfc00U) == 0xdc00) && ((pcVar7[1] & 0xfc00U) == 0xd800)) {
              *pcVar7 = pcVar7[1];
              pcVar7[1] = cVar2;
              pcVar7 = pcVar7 + 2;
            }
            else {
              pcVar7 = pcVar7 + 1;
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doReverse(int32_t start, int32_t length) {
  if(length <= 1 || !cloneArrayIfNeeded()) {
    return *this;
  }

  // pin the indices to legal values
  pinIndices(start, length);
  if(length <= 1) {  // pinIndices() might have shrunk the length
    return *this;
  }

  UChar *left = getArrayStart() + start;
  UChar *right = left + length - 1;  // -1 for inclusive boundary (length>=2)
  UChar swap;
  UBool hasSupplementary = FALSE;

  // Before the loop we know left<right because length>=2.
  do {
    hasSupplementary |= (UBool)U16_IS_LEAD(swap = *left);
    hasSupplementary |= (UBool)U16_IS_LEAD(*left++ = *right);
    *right-- = swap;
  } while(left < right);
  // Make sure to test the middle code unit of an odd-length string.
  // Redundant if the length is even.
  hasSupplementary |= (UBool)U16_IS_LEAD(*left);

  /* if there are supplementary code points in the reversed range, then re-swap their surrogates */
  if(hasSupplementary) {
    UChar swap2;

    left = getArrayStart() + start;
    right = left + length - 1; // -1 so that we can look at *(left+1) if left<right
    while(left < right) {
      if(U16_IS_TRAIL(swap = *left) && U16_IS_LEAD(swap2 = *(left + 1))) {
        *left++ = swap2;
        *left++ = swap;
      } else {
        ++left;
      }
    }
  }

  return *this;
}